

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

int __thiscall FFont::GetCharCode(FFont *this,int code,bool needpic)

{
  bool bVar1;
  int newcode;
  bool needpic_local;
  int code_local;
  FFont *this_local;
  
  newcode = code;
  if ((code < 0) && (-0x81 < code)) {
    newcode = code & 0xff;
  }
  if (((newcode < this->FirstChar) || (this->LastChar < newcode)) ||
     ((needpic && (this->Chars[newcode - this->FirstChar].Pic == (FTexture *)0x0)))) {
    bVar1 = myislower(newcode);
    if (((((!bVar1) || (newcode = newcode + -0x20, newcode < this->FirstChar)) ||
         (this->LastChar < newcode)) ||
        ((this_local._4_4_ = newcode, needpic &&
         (this->Chars[newcode - this->FirstChar].Pic == (FTexture *)0x0)))) &&
       (((this_local._4_4_ = stripaccent(newcode), this_local._4_4_ == newcode ||
         ((this_local._4_4_ < this->FirstChar || (this->LastChar < this_local._4_4_)))) ||
        ((needpic && (this->Chars[this_local._4_4_ - this->FirstChar].Pic == (FTexture *)0x0)))))) {
      this_local._4_4_ = -1;
    }
  }
  else {
    this_local._4_4_ = newcode;
  }
  return this_local._4_4_;
}

Assistant:

int FFont::GetCharCode(int code, bool needpic) const
{
	if (code < 0 && code >= -128)
	{
		// regular chars turn negative when the 8th bit is set.
		code &= 255;
	}
	if (code >= FirstChar && code <= LastChar && (!needpic || Chars[code - FirstChar].Pic != NULL))
	{
		return code;
	}
	// Try converting lowercase characters to uppercase.
	if (myislower(code))
	{
		code -= 32;
		if (code >= FirstChar && code <= LastChar && (!needpic || Chars[code - FirstChar].Pic != NULL))
		{
			return code;
		}
	}
	// Try stripping accents from accented characters.
	int newcode = stripaccent(code);
	if (newcode != code)
	{
		code = newcode;
		if (code >= FirstChar && code <= LastChar && (!needpic || Chars[code - FirstChar].Pic != NULL))
		{
			return code;
		}
	}
	return -1;
}